

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::WriteModelComponentAttributes
          (ON_BinaryArchive *this,ON_ModelComponent *model_component,uint attributes_filter)

{
  bool bVar1;
  Type TVar2;
  uint i;
  ON_UUID *pOVar3;
  undefined1 auStack_4c [4];
  uint component_type_as_unsigned;
  ON_UUID component_id;
  uint instance_definition_model_serial_number;
  uint reference_model_serial_number;
  uint model_serial_number;
  uchar write_status;
  uint bit;
  bool rc;
  uint attributes_filter_local;
  ON_ModelComponent *model_component_local;
  ON_BinaryArchive *this_local;
  
  bVar1 = BeginWrite3dmChunk(this,0x40008002,1,0);
  if (!bVar1) {
    return false;
  }
  this_local._7_1_ = false;
  reference_model_serial_number._3_1_ = (attributes_filter & 4) != 0;
  if (((bool)reference_model_serial_number._3_1_) &&
     (bVar1 = ON_ModelComponent::ModelSerialNumberIsSet(model_component), !bVar1)) {
    reference_model_serial_number._3_1_ = '\x02';
  }
  bVar1 = WriteChar(this,reference_model_serial_number._3_1_);
  if (bVar1) {
    if (reference_model_serial_number._3_1_ == '\x01') {
      i = ON_ModelComponent::ModelSerialNumber(model_component);
      component_id.Data4._4_4_ = ON_ModelComponent::ReferenceModelSerialNumber(model_component);
      component_id.Data4._0_4_ =
           ON_ModelComponent::InstanceDefinitionModelSerialNumber(model_component);
      bVar1 = WriteInt(this,i);
      if (((!bVar1) || (bVar1 = WriteInt(this,component_id.Data4._4_4_), !bVar1)) ||
         (bVar1 = WriteInt(this,component_id.Data4._0_4_), !bVar1)) goto LAB_0076b7a1;
    }
    reference_model_serial_number._3_1_ = (attributes_filter & 8) != 0;
    if (((bool)reference_model_serial_number._3_1_) &&
       (bVar1 = ON_ModelComponent::IdIsSet(model_component), !bVar1)) {
      reference_model_serial_number._3_1_ = '\x02';
    }
    bVar1 = WriteChar(this,reference_model_serial_number._3_1_);
    if (bVar1) {
      if (reference_model_serial_number._3_1_ == '\x01') {
        pOVar3 = ON_ModelComponent::Id(model_component);
        auStack_4c = pOVar3->Data1;
        unique0x00012004 = pOVar3->Data2;
        unique0x00012006 = pOVar3->Data3;
        component_id._0_8_ = *(undefined8 *)pOVar3->Data4;
        bVar1 = WriteUuid(this,(ON_UUID *)auStack_4c);
        if (!bVar1) goto LAB_0076b7a1;
      }
      reference_model_serial_number._3_1_ = (attributes_filter & 2) != 0;
      if (((bool)reference_model_serial_number._3_1_) &&
         (bVar1 = ON_ModelComponent::ComponentTypeIsSet(model_component), !bVar1)) {
        reference_model_serial_number._3_1_ = '\x02';
      }
      bVar1 = WriteChar(this,reference_model_serial_number._3_1_);
      if (bVar1) {
        if (reference_model_serial_number._3_1_ == '\x01') {
          TVar2 = ON_ModelComponent::ComponentType(model_component);
          bVar1 = WriteInt(this,(uint)TVar2);
          if (!bVar1) goto LAB_0076b7a1;
        }
        reference_model_serial_number._3_1_ = (attributes_filter & 0x10) != 0;
        if (((bool)reference_model_serial_number._3_1_) &&
           (bVar1 = ON_ModelComponent::IndexIsSet(model_component), !bVar1)) {
          reference_model_serial_number._3_1_ = '\x02';
        }
        bVar1 = WriteChar(this,reference_model_serial_number._3_1_);
        if ((bVar1) &&
           ((reference_model_serial_number._3_1_ != '\x01' ||
            (bVar1 = Write3dmReferencedComponentIndex(this,model_component), bVar1)))) {
          reference_model_serial_number._3_1_ = (attributes_filter & 0x20) != 0;
          if (((bool)reference_model_serial_number._3_1_) &&
             (bVar1 = ON_ModelComponent::NameIsSet(model_component), !bVar1)) {
            reference_model_serial_number._3_1_ = '\x02';
          }
          bVar1 = WriteChar(this,reference_model_serial_number._3_1_);
          if ((bVar1) &&
             ((reference_model_serial_number._3_1_ != '\x01' ||
              (bVar1 = WriteModelComponentName(this,model_component), bVar1)))) {
            this_local._7_1_ = true;
          }
        }
      }
    }
  }
LAB_0076b7a1:
  bVar1 = EndWrite3dmChunk(this);
  if (!bVar1) {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BinaryArchive::WriteModelComponentAttributes(
  const class ON_ModelComponent& model_component,
  unsigned int attributes_filter
  )
{
  if (false == BeginWrite3dmChunk(TCODE_MODEL_ATTRIBUTES_CHUNK,1,0))
    return false;

  bool rc = false;
  for (;;)
  {
    unsigned int bit = ON_ModelComponent::Attributes::ModelSerialNumberAttribute & attributes_filter;
    unsigned char write_status = (0 != bit) ? 1 : 0;
    if ( 0 != write_status && false == model_component.ModelSerialNumberIsSet() )
      write_status = 2;
    if (!WriteChar(write_status))
      break;
    if (1 == write_status )
    {
      const unsigned int model_serial_number = model_component.ModelSerialNumber();
      const unsigned int reference_model_serial_number = model_component.ReferenceModelSerialNumber();
      const unsigned int instance_definition_model_serial_number = model_component.InstanceDefinitionModelSerialNumber();
      if ( !WriteInt(model_serial_number) )
        break;
      if ( !WriteInt(reference_model_serial_number) )
        break;
      if ( !WriteInt(instance_definition_model_serial_number) )
        break;
    }

    bit = ON_ModelComponent::Attributes::IdAttribute & attributes_filter;
    write_status = (0 != bit) ? 1 : 0;
    if ( 0 != write_status && false == model_component.IdIsSet() )
      write_status = 2;
    if (!WriteChar(write_status))
      break;
    if (1 == write_status )
    {
      ON_UUID component_id = model_component.Id();
      if ( !WriteUuid(component_id) )
        break;
    }

    bit = ON_ModelComponent::Attributes::TypeAttribute & attributes_filter;
    write_status = (0 != bit) ? 1 : 0;
    if ( 0 != write_status && false == model_component.ComponentTypeIsSet() )
      write_status = 2;
    if (!WriteChar(write_status))
      break;
    if (1 == write_status )
    {
      unsigned int component_type_as_unsigned = static_cast<unsigned int>(model_component.ComponentType());
      if ( !WriteInt(component_type_as_unsigned) )
        break;
    }

    bit = ON_ModelComponent::Attributes::IndexAttribute & attributes_filter;
    write_status = (0 != bit) ? 1 : 0;
    if ( 0 != write_status && false == model_component.IndexIsSet() )
      write_status = 2;
    if (!WriteChar(write_status))
      break;
    if (1 == write_status )
    {
      if ( !Write3dmReferencedComponentIndex( model_component ) )
        break;
    }

    bit = ON_ModelComponent::Attributes::NameAttribute & attributes_filter;
    write_status = (0 != bit) ? 1 : 0;
    if ( 0 != write_status && false == model_component.NameIsSet() )
      write_status = 2;
    if (!WriteChar(write_status))
      break;
    if (1 == write_status )
    {
      if (false == this->WriteModelComponentName(model_component) )
        break;
    }

    rc = true;
    break;
  }

  if (false == EndWrite3dmChunk())
    rc = false;

  return rc;
}